

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::VideoTrack::SetColour(VideoTrack *this,Colour *colour)

{
  bool bVar1;
  Colour *this_00;
  pointer pCVar2;
  MasteringMetadata *pMVar3;
  uint64_t uVar4;
  Colour *in_RSI;
  long in_RDI;
  unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> colour_ptr;
  pointer in_stack_fffffffffffffec8;
  void *pvVar5;
  pointer in_stack_fffffffffffffed0;
  MasteringMetadata *in_stack_ffffffffffffff40;
  Colour *in_stack_ffffffffffffff48;
  undefined1 local_1;
  
  this_00 = (Colour *)operator_new(0x70);
  Colour::Colour(this_00);
  std::unique_ptr<mkvmuxer::Colour,std::default_delete<mkvmuxer::Colour>>::
  unique_ptr<std::default_delete<mkvmuxer::Colour>,void>
            ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::get
                     ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                      in_stack_fffffffffffffed0);
  if (pCVar2 == (pointer)0x0) {
    local_1 = false;
  }
  else {
    pMVar3 = Colour::mastering_metadata(in_RSI);
    if (pMVar3 != (MasteringMetadata *)0x0) {
      std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)0x1742a2);
      Colour::mastering_metadata(in_RSI);
      bVar1 = Colour::SetMasteringMetadata(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      if (!bVar1) {
        local_1 = false;
        goto LAB_00174696;
      }
    }
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174339);
    uVar4 = Colour::matrix_coefficients(in_RSI);
    Colour::set_matrix_coefficients(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x17437c);
    uVar4 = Colour::bits_per_channel(in_RSI);
    Colour::set_bits_per_channel(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x1743bf);
    uVar4 = Colour::chroma_subsampling_horz(in_RSI);
    Colour::set_chroma_subsampling_horz(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174402);
    uVar4 = Colour::chroma_subsampling_vert(in_RSI);
    Colour::set_chroma_subsampling_vert(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174445);
    uVar4 = Colour::cb_subsampling_horz(in_RSI);
    Colour::set_cb_subsampling_horz(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174488);
    uVar4 = Colour::cb_subsampling_vert(in_RSI);
    Colour::set_cb_subsampling_vert(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x1744c5);
    uVar4 = Colour::chroma_siting_horz(in_RSI);
    Colour::set_chroma_siting_horz(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x1744fc);
    uVar4 = Colour::chroma_siting_vert(in_RSI);
    Colour::set_chroma_siting_vert(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174533);
    uVar4 = Colour::range(in_RSI);
    Colour::set_range(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x17456a);
    uVar4 = Colour::transfer_characteristics(in_RSI);
    Colour::set_transfer_characteristics(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x1745a1);
    uVar4 = Colour::primaries(in_RSI);
    Colour::set_primaries(pCVar2,uVar4);
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x1745d8);
    uVar4 = Colour::max_cll(in_RSI);
    Colour::set_max_cll(pCVar2,uVar4);
    in_stack_fffffffffffffed0 =
         std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::operator->
                   ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)0x17460f
                   );
    uVar4 = Colour::max_fall(in_RSI);
    Colour::set_max_fall(in_stack_fffffffffffffed0,uVar4);
    pvVar5 = *(void **)(in_RDI + 0xe8);
    if (pvVar5 != (void *)0x0) {
      Colour::~Colour(in_stack_fffffffffffffed0);
      operator_delete(pvVar5);
    }
    pCVar2 = std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::release
                       ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
                        0x174671);
    *(pointer *)(in_RDI + 0xe8) = pCVar2;
    local_1 = true;
  }
LAB_00174696:
  std::unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_>::~unique_ptr
            ((unique_ptr<mkvmuxer::Colour,_std::default_delete<mkvmuxer::Colour>_> *)
             in_stack_fffffffffffffed0);
  return local_1;
}

Assistant:

bool VideoTrack::SetColour(const Colour& colour) {
  std::unique_ptr<Colour> colour_ptr(new Colour());
  if (!colour_ptr.get())
    return false;

  if (colour.mastering_metadata()) {
    if (!colour_ptr->SetMasteringMetadata(*colour.mastering_metadata()))
      return false;
  }

  colour_ptr->set_matrix_coefficients(colour.matrix_coefficients());
  colour_ptr->set_bits_per_channel(colour.bits_per_channel());
  colour_ptr->set_chroma_subsampling_horz(colour.chroma_subsampling_horz());
  colour_ptr->set_chroma_subsampling_vert(colour.chroma_subsampling_vert());
  colour_ptr->set_cb_subsampling_horz(colour.cb_subsampling_horz());
  colour_ptr->set_cb_subsampling_vert(colour.cb_subsampling_vert());
  colour_ptr->set_chroma_siting_horz(colour.chroma_siting_horz());
  colour_ptr->set_chroma_siting_vert(colour.chroma_siting_vert());
  colour_ptr->set_range(colour.range());
  colour_ptr->set_transfer_characteristics(colour.transfer_characteristics());
  colour_ptr->set_primaries(colour.primaries());
  colour_ptr->set_max_cll(colour.max_cll());
  colour_ptr->set_max_fall(colour.max_fall());
  delete colour_;
  colour_ = colour_ptr.release();
  return true;
}